

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_serializer.cpp
# Opt level: O3

void __thiscall duckdb::BinarySerializer::WriteValue(BinarySerializer *this,uint16_t value)

{
  ushort uVar1;
  idx_t offset;
  long lVar2;
  ulong uVar3;
  uint8_t buffer [16];
  byte local_18 [24];
  
  local_18[0] = 0;
  local_18[1] = 0;
  local_18[2] = 0;
  local_18[3] = 0;
  local_18[4] = 0;
  local_18[5] = 0;
  local_18[6] = 0;
  local_18[7] = 0;
  local_18[8] = 0;
  local_18[9] = 0;
  local_18[10] = 0;
  local_18[0xb] = 0;
  local_18[0xc] = 0;
  local_18[0xd] = 0;
  local_18[0xe] = 0;
  local_18[0xf] = 0;
  lVar2 = 0;
  uVar3 = (ulong)value;
  do {
    uVar1 = (ushort)uVar3;
    local_18[lVar2] = (0x7f < uVar1) << 7 | (byte)uVar3 & 0x7f;
    lVar2 = lVar2 + 1;
    uVar3 = uVar3 >> 7;
  } while (0x7f < uVar1);
  (**this->stream->_vptr_WriteStream)(this->stream,local_18);
  return;
}

Assistant:

void BinarySerializer::WriteValue(uint16_t value) {
	VarIntEncode(value);
}